

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O2

Dec_Graph_t * Dec_Factor(char *pSop)

{
  int *piVar1;
  char cVar2;
  Mvc_Manager_t *pMem;
  bool bVar3;
  int iVar4;
  int iVar5;
  Dec_Edge_t DVar6;
  Dec_Graph_t *pDVar7;
  undefined8 *puVar8;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar9;
  Dec_Node_t *__s;
  byte bVar10;
  Mvc_Cube_t *pMVar11;
  uint uVar12;
  Mvc_CubeWord_t MVar13;
  ulong uVar14;
  Mvc_List_t *pList;
  char *pcVar15;
  
  iVar4 = Abc_SopIsConst0(pSop);
  if (iVar4 == 0) {
    iVar4 = Abc_SopIsConst1(pSop);
    if (iVar4 == 0) {
      puVar8 = (undefined8 *)Abc_FrameReadManDec();
      pMem = (Mvc_Manager_t *)*puVar8;
      iVar4 = Abc_SopGetVarNum(pSop);
      if (iVar4 < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,0x151,"Mvc_Cover_t *Dec_ConvertSopToMvc(char *)");
      }
      pCover = Mvc_CoverAlloc(pMem,iVar4 * 2);
      pcVar15 = pSop;
LAB_004c0104:
      if (*pcVar15 == '\0') {
        Mvc_CoverContain(pCover);
        iVar4 = Mvc_CoverIsEmpty(pCover);
        if (iVar4 == 0) {
          iVar4 = Mvc_CoverIsTautology(pCover);
          if (iVar4 == 0) {
            Mvc_CoverInverse(pCover);
            iVar5 = Abc_SopGetVarNum(pSop);
            pDVar7 = (Dec_Graph_t *)calloc(1,0x20);
            pDVar7->nLeaves = iVar5;
            pDVar7->nSize = iVar5;
            iVar4 = iVar5 * 2 + 0x32;
            pDVar7->nCap = iVar4;
            __s = (Dec_Node_t *)malloc((long)iVar4 * 0x18);
            pDVar7->pNodes = __s;
            memset(__s,0,(long)iVar5 * 0x18);
            DVar6 = Dec_Factor_rec(pDVar7,pCover);
            pDVar7->eRoot = DVar6;
            iVar4 = Abc_SopIsComplement(pSop);
            if (iVar4 != 0) {
              *(byte *)&pDVar7->eRoot = *(byte *)&pDVar7->eRoot ^ 1;
            }
            Mvc_CoverFree(pCover);
            return pDVar7;
          }
          pcVar15 = "!Mvc_CoverIsTautology(pCover)";
          uVar12 = 0x4c;
        }
        else {
          pcVar15 = "!Mvc_CoverIsEmpty(pCover)";
          uVar12 = 0x4b;
        }
        __assert_fail(pcVar15,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,uVar12,"Dec_Graph_t *Dec_Factor(char *)");
      }
      pMVar9 = Mvc_CubeAlloc(pCover);
      pMVar11 = (Mvc_Cube_t *)&pCover->lCubes;
      if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar11 = (pCover->lCubes).pTail;
      }
      pMVar11->pNext = pMVar9;
      (pCover->lCubes).pTail = pMVar9;
      pMVar9->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      uVar12 = *(uint *)&pMVar9->field_0x8 & 0xffffff;
      bVar10 = (byte)(*(uint *)&pMVar9->field_0x8 >> 0x18);
      if ((ulong)uVar12 == 1) {
        pMVar9->pData[0] = 0xffffffff;
        *(uint *)&pMVar9->field_0x14 = 0xffffffff >> (bVar10 & 0x1f);
      }
      else if (uVar12 == 0) {
        pMVar9->pData[0] = 0xffffffff >> (bVar10 & 0x1f);
      }
      else {
        MVar13 = 0xffffffff >> (bVar10 & 0x1f);
        uVar14 = (ulong)uVar12;
        do {
          pMVar9->pData[uVar14] = MVar13;
          MVar13 = 0xffffffff;
          bVar3 = 0 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar3);
      }
      bVar10 = 0;
      uVar14 = 0;
      do {
        cVar2 = pcVar15[uVar14];
        iVar5 = 2;
        if (cVar2 == '0') {
LAB_004c019d:
          pMVar9->pData[uVar14 >> 4 & 0xfffffff] =
               pMVar9->pData[uVar14 >> 4 & 0xfffffff] & ~(iVar5 << (bVar10 & 0x1e));
        }
        else {
          if (cVar2 == '1') {
            iVar5 = 1;
            goto LAB_004c019d;
          }
          if ((cVar2 == '\0') || (cVar2 == ' ')) goto LAB_004c01b7;
        }
        uVar14 = uVar14 + 1;
        bVar10 = bVar10 + 2;
      } while( true );
    }
    pDVar7 = (Dec_Graph_t *)calloc(1,0x20);
    pDVar7->fConst = 1;
  }
  else {
    pDVar7 = (Dec_Graph_t *)calloc(1,0x20);
    pDVar7->fConst = 1;
    pDVar7->eRoot = (Dec_Edge_t)0x1;
  }
  return pDVar7;
LAB_004c01b7:
  pcVar15 = pcVar15 + (iVar4 + 3);
  goto LAB_004c0104;
}

Assistant:

Dec_Graph_t * Dec_Factor( char * pSop )
{
    Mvc_Cover_t * pCover;
    Dec_Graph_t * pFForm;
    Dec_Edge_t eRoot;
    if ( Abc_SopIsConst0(pSop) )
        return Dec_GraphCreateConst0();
    if ( Abc_SopIsConst1(pSop) )
        return Dec_GraphCreateConst1();

    // derive the cover from the SOP representation
    pCover = Dec_ConvertSopToMvc( pSop );

    // make sure the cover is CCS free (should be done before CST)
    Mvc_CoverContain( pCover );

    // check for trivial functions
    assert( !Mvc_CoverIsEmpty(pCover) );
    assert( !Mvc_CoverIsTautology(pCover) );

    // perform CST
    Mvc_CoverInverse( pCover ); // CST
    // start the factored form
    pFForm = Dec_GraphCreate( Abc_SopGetVarNum(pSop) );
    // factor the cover
    eRoot = Dec_Factor_rec( pFForm, pCover );
    // finalize the factored form
    Dec_GraphSetRoot( pFForm, eRoot );
    // complement the factored form if SOP is complemented
    if ( Abc_SopIsComplement(pSop) )
        Dec_GraphComplement( pFForm );
    // verify the factored form
//    if ( !Dec_FactorVerify( pSop, pFForm ) )
//        printf( "Verification has failed.\n" );
//    Mvc_CoverInverse( pCover ); // undo CST
    Mvc_CoverFree( pCover );
    return pFForm;
}